

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::ShaderCompilerCase::setShaderInputs
          (ShaderCompilerCase *this,deUint32 program,ProgramContext *progCtx)

{
  code *pcVar1;
  int iVar2;
  deInt32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar6;
  undefined8 uVar7;
  const_reference pvVar8;
  float *pfVar9;
  const_reference pvVar10;
  float *floatPtr;
  int location_1;
  int uniformNdx;
  int location;
  int attribNdx;
  Functions *gl;
  ProgramContext *progCtx_local;
  deUint32 program_local;
  ShaderCompilerCase *this_local;
  long lVar5;
  
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  for (uniformNdx = 0;
      sVar6 = std::
              vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              ::size(&progCtx->vertexAttributes), uniformNdx < (int)sVar6;
      uniformNdx = uniformNdx + 1) {
    pcVar1 = *(code **)(lVar5 + 0x780);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
    ::operator[](&progCtx->vertexAttributes,(long)uniformNdx);
    uVar7 = std::__cxx11::string::c_str();
    iVar2 = (*pcVar1)(program,uVar7);
    if (-1 < iVar2) {
      (**(code **)(lVar5 + 0x610))(iVar2);
      pcVar1 = *(code **)(lVar5 + 0x19f0);
      pvVar8 = std::
               vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
               ::operator[](&progCtx->vertexAttributes,(long)uniformNdx);
      pfVar9 = tcu::Vector<float,_16>::getPtr(&pvVar8->value);
      (*pcVar1)(iVar2,4,0x1406,0,0,pfVar9);
    }
  }
  for (floatPtr._4_4_ = 0;
      sVar6 = std::
              vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              ::size(&progCtx->uniforms), floatPtr._4_4_ < (int)sVar6;
      floatPtr._4_4_ = floatPtr._4_4_ + 1) {
    pcVar1 = *(code **)(lVar5 + 0xb48);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ::operator[](&progCtx->uniforms,(long)floatPtr._4_4_);
    uVar7 = std::__cxx11::string::c_str();
    iVar2 = (*pcVar1)(program,uVar7);
    if (-1 < iVar2) {
      pvVar10 = std::
                vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                ::operator[](&progCtx->uniforms,(long)floatPtr._4_4_);
      pfVar9 = tcu::Vector<float,_16>::getPtr(&pvVar10->value);
      pvVar10 = std::
                vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                ::operator[](&progCtx->uniforms,(long)floatPtr._4_4_);
      switch(pvVar10->type) {
      case TYPE_FLOAT:
        (**(code **)(lVar5 + 0x14e8))(iVar2,1,pfVar9);
        break;
      case TYPE_VEC2:
        (**(code **)(lVar5 + 0x1528))(iVar2,1,pfVar9);
        break;
      case TYPE_VEC3:
        (**(code **)(lVar5 + 0x1568))(iVar2,1,pfVar9);
        break;
      case TYPE_VEC4:
        (**(code **)(lVar5 + 0x15a8))(iVar2,1,pfVar9);
        break;
      case TYPE_MAT3:
        (**(code **)(lVar5 + 0x1610))(iVar2,1,0,pfVar9);
        break;
      case TYPE_MAT4:
        (**(code **)(lVar5 + 0x1640))(iVar2,1,0,pfVar9);
        break;
      case TYPE_TEXTURE_UNIT:
        pcVar1 = *(code **)(lVar5 + 0x14f0);
        dVar3 = deRoundFloatToInt32(*pfVar9);
        (*pcVar1)(iVar2,dVar3);
      }
    }
  }
  return;
}

Assistant:

void ShaderCompilerCase::setShaderInputs (deUint32 program, const ProgramContext& progCtx) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Setup attributes.

	for (int attribNdx = 0; attribNdx < (int)progCtx.vertexAttributes.size(); attribNdx++)
	{
		int location = gl.getAttribLocation(program, progCtx.vertexAttributes[attribNdx].name.c_str());
		if (location >= 0)
		{
			gl.enableVertexAttribArray(location);
			gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, 0, progCtx.vertexAttributes[attribNdx].value.getPtr());
		}
	}

	// Setup uniforms.

	for (int uniformNdx = 0; uniformNdx < (int)progCtx.uniforms.size(); uniformNdx++)
	{
		int location = gl.getUniformLocation(program, progCtx.uniforms[uniformNdx].name.c_str());
		if (location >= 0)
		{
			const float* floatPtr = progCtx.uniforms[uniformNdx].value.getPtr();

			switch (progCtx.uniforms[uniformNdx].type)
			{
				case UniformSpec::TYPE_FLOAT:			gl.uniform1fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC2:			gl.uniform2fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC3:			gl.uniform3fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC4:			gl.uniform4fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_MAT3:			gl.uniformMatrix3fv(location, 1, GL_FALSE, floatPtr);				break;
				case UniformSpec::TYPE_MAT4:			gl.uniformMatrix4fv(location, 1, GL_FALSE, floatPtr);				break;
				case UniformSpec::TYPE_TEXTURE_UNIT:	gl.uniform1i(location, (GLint)deRoundFloatToInt32(*floatPtr));		break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}
	}
}